

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformAction<ot::commissioner::Error()>
          (Action<ot::commissioner::Error_()> *action,ArgumentTuple *args)

{
  ActionResultHolder<ot::commissioner::Error> *this;
  undefined1 local_60 [40];
  undefined1 local_38 [40];
  
  this = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  Action<ot::commissioner::Error_()>::Perform(local_60,action);
  ot::commissioner::Error::Error((Error *)local_38,(Error *)local_60);
  ActionResultHolder(this,(Wrapper *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)(local_60 + 8));
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }